

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::piece_info_alert>
               (char *dst,char *src)

{
  int *piVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  
  piece_info_alert::piece_info_alert((piece_info_alert *)dst,(piece_info_alert *)src);
  pvVar2 = *(void **)(src + 0x48);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(src + 0x58) - (long)pvVar2);
  }
  pvVar2 = *(void **)(src + 0x30);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(src + 0x40) - (long)pvVar2);
  }
  *(undefined ***)src = &PTR__torrent_alert_004ebb90;
  plVar3 = *(long **)(src + 0x18);
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar3 + 0xc);
      iVar4 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = *(int *)((long)plVar3 + 0xc);
      *(int *)((long)plVar3 + 0xc) = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (**(code **)(*plVar3 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}